

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instruction.cpp
# Opt level: O2

void __thiscall Hpipe::Instruction::update_in_a_cycle(Instruction *this)

{
  Instruction *pIVar1;
  pointer pTVar2;
  pointer ppVar3;
  uint uVar4;
  Vec<std::pair<Hpipe::Instruction_*,_unsigned_int>_> stack;
  Instruction *local_28;
  int local_1c;
  
  cur_op_id = cur_op_id + 1;
  stack.
  super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
  .
  super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stack.
  super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
  .
  super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stack.
  super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
  .
  super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1c = 0;
  local_28 = this;
  std::
  vector<std::pair<Hpipe::Instruction*,unsigned_int>,std::allocator<std::pair<Hpipe::Instruction*,unsigned_int>>>
  ::emplace_back<Hpipe::Instruction*,int>
            ((vector<std::pair<Hpipe::Instruction*,unsigned_int>,std::allocator<std::pair<Hpipe::Instruction*,unsigned_int>>>
              *)&stack,&local_28,&local_1c);
  do {
    pIVar1 = stack.
             super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
             .
             super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1].first;
    if (pIVar1->op_id == cur_op_id) {
      stack.
      super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
      .
      super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           stack.
           super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
           .
           super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + -1;
      uVar4 = pIVar1->num_in_dfs_stack;
      if (-1 < (int)uVar4) {
        for (; (ulong)uVar4 <
               (ulong)((long)stack.
                             super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                             .
                             super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)stack.
                             super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                             .
                             super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4); uVar4 = uVar4 + 1) {
          (stack.
           super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
           .
           super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar4].first)->in_a_cycle = true;
        }
      }
    }
    else {
      pIVar1->op_id = cur_op_id;
      pIVar1->num_in_dfs_stack =
           (int)((ulong)((long)stack.
                               super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                               .
                               super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)stack.
                              super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                              .
                              super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1;
    }
    while( true ) {
      ppVar3 = stack.
               super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
               .
               super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
      uVar4 = stack.
              super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
              .
              super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].second;
      pIVar1 = ppVar3->first;
      pTVar2 = (pIVar1->next).super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
               super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)uVar4 <
          (ulong)(((long)(pIVar1->next).
                         super_vector<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         super__Vector_base<Hpipe::Transition,_std::allocator<Hpipe::Transition>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2) / 0x28)) break;
      pIVar1->num_in_dfs_stack = -1;
      stack.
      super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
      .
      super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar3;
      if (ppVar3 == stack.
                    super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                    .
                    super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start) {
        std::
        _Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
        ::~_Vector_base((_Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
                         *)&stack);
        return;
      }
    }
    stack.
    super_vector<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
    .
    super__Vector_base<std::pair<Hpipe::Instruction_*,_unsigned_int>,_std::allocator<std::pair<Hpipe::Instruction_*,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish[-1].second = uVar4 + 1;
    local_28 = (Instruction *)((ulong)local_28 & 0xffffffff00000000);
    std::
    vector<std::pair<Hpipe::Instruction*,unsigned_int>,std::allocator<std::pair<Hpipe::Instruction*,unsigned_int>>>
    ::emplace_back<Hpipe::Instruction*&,int>
              ((vector<std::pair<Hpipe::Instruction*,unsigned_int>,std::allocator<std::pair<Hpipe::Instruction*,unsigned_int>>>
                *)&stack,&pTVar2[uVar4].inst,(int *)&local_28);
  } while( true );
}

Assistant:

void Instruction::update_in_a_cycle() {
    ++Instruction::cur_op_id;
    Vec<std::pair<Instruction *,unsigned>> stack;
    stack.emplace_back( this, 0 );
    while ( true ) {
        std::pair<Instruction *,unsigned> t = stack.back();

        // instruction
        if ( t.first->op_id == Instruction::cur_op_id ) {
            stack.pop_back();
            if ( t.first->num_in_dfs_stack >= 0 )
                for( unsigned j = t.first->num_in_dfs_stack; j < stack.size(); ++j )
                    stack[ j ].first->in_a_cycle = true;
        } else {
            t.first->op_id = Instruction::cur_op_id;
            t.first->num_in_dfs_stack = stack.size() - 1;
        }

        // next
        while ( stack.back().second >= stack.back().first->next.size() ) {
            stack.back().first->num_in_dfs_stack = - 1;
            stack.pop_back();
            if ( stack.empty() )
                return;
        }
        stack.emplace_back( stack.back().first->next[ stack.back().second++ ].inst, 0 );
    }
}